

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

Schema __thiscall capnp::SchemaLoader::loadOnce(SchemaLoader *this,Reader *reader)

{
  Own<capnp::SchemaLoader::Impl> *pOVar1;
  Impl *pIVar2;
  uint64_t typeId;
  RawSchema *pRVar3;
  TryGetResult TVar4;
  TryGetResult getResult;
  Locked<kj::Own<capnp::SchemaLoader::Impl>_> locked;
  Reader *reader_local;
  SchemaLoader *this_local;
  
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_> *)&getResult.callback);
  pOVar1 = kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::operator->
                     ((Locked<kj::Own<capnp::SchemaLoader::Impl>_> *)&getResult.callback);
  pIVar2 = kj::Own<capnp::SchemaLoader::Impl>::get(pOVar1);
  typeId = capnp::schema::Node::Reader::getId(reader);
  TVar4 = Impl::tryGet(pIVar2,typeId);
  getResult.schema = (RawSchema *)TVar4.callback.ptr;
  pRVar3 = TVar4.schema;
  if ((pRVar3 == (RawSchema *)0x0) || (pRVar3->lazyInitializer != (Initializer *)0x0)) {
    pOVar1 = kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::operator->
                       ((Locked<kj::Own<capnp::SchemaLoader::Impl>_> *)&getResult.callback);
    pIVar2 = kj::Own<capnp::SchemaLoader::Impl>::get(pOVar1);
    pRVar3 = Impl::load(pIVar2,reader,false);
    Schema::Schema((Schema *)&this_local,&pRVar3->defaultBrand);
  }
  else {
    Schema::Schema((Schema *)&this_local,&pRVar3->defaultBrand);
  }
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::~Locked
            ((Locked<kj::Own<capnp::SchemaLoader::Impl>_> *)&getResult.callback);
  return (Schema)(RawBrandedSchema *)this_local;
}

Assistant:

Schema SchemaLoader::loadOnce(const schema::Node::Reader& reader) const {
  auto locked = impl.lockExclusive();
  auto getResult = locked->get()->tryGet(reader.getId());
  if (getResult.schema == nullptr || getResult.schema->lazyInitializer != nullptr) {
    // Doesn't exist yet, or the existing schema is a placeholder and therefore has not yet been
    // seen publicly.  Go ahead and load the incoming reader.
    return Schema(&locked->get()->load(reader, false)->defaultBrand);
  } else {
    return Schema(&getResult.schema->defaultBrand);
  }
}